

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O1

void wabt::interp::WriteValue(Stream *stream,TypedValue *tv)

{
  TypedValue *in_RDX;
  string s;
  string local_30;
  
  TypedValueToString_abi_cxx11_(&local_30,(interp *)tv,in_RDX);
  Stream::WriteData(stream,local_30._M_dataplus._M_p,local_30._M_string_length,(char *)0x0,No);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WriteValue(Stream* stream, const TypedValue& tv) {
  std::string s = TypedValueToString(tv);
  stream->WriteData(s.data(), s.size());
}